

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void TorControlConnection::eventcb(bufferevent *bev,short what,void *ctx)

{
  bool bVar1;
  ushort in_SI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  string_view in_stack_00000010;
  TorControlConnection *self;
  Level in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  function<void_(TorControlConnection_&)> *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  LogFlags in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  ConstevalFormatString<0U> fmt;
  
  fmt.fmt = *(char **)(in_FS_OFFSET + 0x28);
  if ((in_SI & 0x80) == 0) {
    if ((in_SI & 0x30) != 0) {
      if ((in_SI & 0x20) == 0) {
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          in_stack_ffffffffffffff48 = 1;
          in_stack_ffffffffffffff50 = "End of stream\n";
          LogPrintFormatInternal<>
                    (in_stack_00000010,in_stack_00000000,in_stack_ffffffffffffffbc,
                     in_stack_ffffffffffffffb0,in_stack_000000f0,fmt);
        }
      }
      else {
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          in_stack_ffffffffffffff48 = 1;
          in_stack_ffffffffffffff50 = "Error connecting to Tor control socket\n";
          LogPrintFormatInternal<>
                    (in_stack_00000010,in_stack_00000000,in_stack_ffffffffffffffbc,
                     in_stack_ffffffffffffffb0,in_stack_000000f0,fmt);
        }
      }
      Disconnect((TorControlConnection *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      std::function<void_(TorControlConnection_&)>::operator()
                (in_stack_ffffffffffffff58,(TorControlConnection *)in_stack_ffffffffffffff50);
    }
  }
  else {
    bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),Trace)
    ;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff50 = "Successfully connected!\n";
      LogPrintFormatInternal<>
                (in_stack_00000010,in_stack_00000000,in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb0,in_stack_000000f0,fmt);
    }
    std::function<void_(TorControlConnection_&)>::operator()
              (in_stack_ffffffffffffff58,(TorControlConnection *)in_stack_ffffffffffffff50);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != fmt.fmt) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TorControlConnection::eventcb(struct bufferevent *bev, short what, void *ctx)
{
    TorControlConnection *self = static_cast<TorControlConnection*>(ctx);
    if (what & BEV_EVENT_CONNECTED) {
        LogDebug(BCLog::TOR, "Successfully connected!\n");
        self->connected(*self);
    } else if (what & (BEV_EVENT_EOF|BEV_EVENT_ERROR)) {
        if (what & BEV_EVENT_ERROR) {
            LogDebug(BCLog::TOR, "Error connecting to Tor control socket\n");
        } else {
            LogDebug(BCLog::TOR, "End of stream\n");
        }
        self->Disconnect();
        self->disconnected(*self);
    }
}